

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

Abc_Cex_t * Ga2_ManDeriveCex(Ga2_Man_t *p,Vec_Int_t *vPis)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Man_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  iVar6 = p->pGia->nRegs;
  pAVar5 = Abc_CexAlloc(iVar6,p->pGia->vCis->nSize - iVar6,p->pPars->iFrame + 1);
  pAVar5->iPo = 0;
  iVar6 = p->pPars->iFrame;
  pAVar5->iFrame = iVar6;
  iVar8 = vPis->nSize;
  if (0 < iVar8) {
    lVar7 = 0;
    do {
      iVar1 = vPis->pArray[lVar7];
      if (((long)iVar1 < 0) || (pGVar2 = p->pGia, pGVar2->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar5;
      }
      pObj = pGVar2->pObjs + iVar1;
      if ((((~(uint)*(undefined8 *)pObj & 0x9fffffff) == 0) &&
          ((int)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <
           pGVar2->vCis->nSize - pGVar2->nRegs)) && (-1 < iVar6)) {
        iVar8 = -1;
        do {
          iVar8 = iVar8 + 1;
          uVar4 = Ga2_ObjFindLit(p,pObj,iVar8);
          uVar3 = *(ulong *)pObj;
          if ((~uVar3 & 0x1fffffff1fffffff) == 0) {
            __assert_fail("!Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                          ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
          }
          if (uVar4 != 0xffffffff) {
            if ((int)uVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            if (((int)(uVar4 >> 1) < p->pSat->size) &&
               (((p->pSat->model[uVar4 >> 1] != 1 ^ (byte)uVar4) & 1) == 0)) {
              if (-1 < (int)uVar3) {
                __assert_fail("pObj->fTerm",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
              }
              iVar6 = ((uint)(uVar3 >> 0x20) & 0x1fffffff) + pAVar5->nRegs + pAVar5->nPis * iVar8;
              (&pAVar5[1].iPo)[iVar6 >> 5] =
                   (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
            }
          }
          iVar6 = pAVar5->iFrame;
        } while (iVar8 < iVar6);
        iVar8 = vPis->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar8);
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Ga2_ManDeriveCex( Ga2_Man_t * p, Vec_Int_t * vPis )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, f;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
    {
        if ( !Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        assert( Gia_ObjIsPi(p->pGia, pObj) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Gia_ObjCioId(pObj) );
    }
    return pCex;
}